

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_internal.cc
# Opt level: O2

void __thiscall absl::status_internal::StatusRep::Unref(StatusRep *this)

{
  if ((this->ref_).super___atomic_base<int>._M_i != 1) {
    LOCK();
    (this->ref_).super___atomic_base<int>._M_i = (this->ref_).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((this->ref_).super___atomic_base<int>._M_i != 0) {
      return;
    }
  }
  ~StatusRep(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

void StatusRep::Unref() const {
  // Fast path: if ref==1, there is no need for a RefCountDec (since
  // this is the only reference and therefore no other thread is
  // allowed to be mucking with r).
  if (ref_.load(std::memory_order_acquire) == 1 ||
      ref_.fetch_sub(1, std::memory_order_acq_rel) - 1 == 0) {
    delete this;
  }
}